

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack29_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x1fffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1d;
  *puVar1 = (in[1] & 0x3ffffff) << 3 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x1a;
  *puVar1 = (in[2] & 0x7fffff) << 6 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0x17;
  *puVar1 = (in[3] & 0xfffff) << 9 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 0x14;
  *puVar1 = (in[4] & 0x1ffff) << 0xc | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[4] >> 0x11;
  *puVar1 = (in[5] & 0x3fff) << 0xf | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[5] >> 0xe;
  *puVar1 = (in[6] & 0x7ff) << 0x12 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[6] >> 0xb;
  *puVar1 = (in[7] & 0xff) << 0x15 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[7] >> 8;
  *puVar1 = (in[8] & 0x1f) << 0x18 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[8] >> 5;
  puVar2 = in + 9;
  *puVar1 = (*puVar2 & 3) << 0x1b | *puVar1;
  out[10] = *puVar2 >> 2 & 0x1fffffff;
  puVar1 = out + 0xb;
  *puVar1 = *puVar2 >> 0x1f;
  *puVar1 = (in[10] & 0xfffffff) << 1 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[10] >> 0x1c;
  *puVar1 = (in[0xb] & 0x1ffffff) << 4 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0xb] >> 0x19;
  *puVar1 = (in[0xc] & 0x3fffff) << 7 | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0xc] >> 0x16;
  *puVar1 = (in[0xd] & 0x7ffff) << 10 | *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[0xd] >> 0x13;
  *puVar1 = (in[0xe] & 0xffff) << 0xd | *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[0xe] >> 0x10;
  *puVar1 = (in[0xf] & 0x1fff) << 0x10 | *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = in[0xf] >> 0xd;
  *puVar1 = (in[0x10] & 0x3ff) << 0x13 | *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0x10] >> 10;
  *puVar1 = (in[0x11] & 0x7f) << 0x16 | *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = in[0x11] >> 7;
  *puVar1 = (in[0x12] & 0xf) << 0x19 | *puVar1;
  puVar1 = out + 0x14;
  *puVar1 = in[0x12] >> 4;
  puVar2 = in + 0x13;
  *puVar1 = (*puVar2 & 1) << 0x1c | *puVar1;
  out[0x15] = *puVar2 >> 1 & 0x1fffffff;
  puVar1 = out + 0x16;
  *puVar1 = *puVar2 >> 0x1e;
  *puVar1 = (in[0x14] & 0x7ffffff) << 2 | *puVar1;
  puVar1 = out + 0x17;
  *puVar1 = in[0x14] >> 0x1b;
  *puVar1 = (in[0x15] & 0xffffff) << 5 | *puVar1;
  puVar1 = out + 0x18;
  *puVar1 = in[0x15] >> 0x18;
  *puVar1 = (in[0x16] & 0x1fffff) << 8 | *puVar1;
  puVar1 = out + 0x19;
  *puVar1 = in[0x16] >> 0x15;
  *puVar1 = (in[0x17] & 0x3ffff) << 0xb | *puVar1;
  puVar1 = out + 0x1a;
  *puVar1 = in[0x17] >> 0x12;
  *puVar1 = (in[0x18] & 0x7fff) << 0xe | *puVar1;
  puVar1 = out + 0x1b;
  *puVar1 = in[0x18] >> 0xf;
  *puVar1 = (in[0x19] & 0xfff) << 0x11 | *puVar1;
  puVar1 = out + 0x1c;
  *puVar1 = in[0x19] >> 0xc;
  *puVar1 = (in[0x1a] & 0x1ff) << 0x14 | *puVar1;
  puVar1 = out + 0x1d;
  *puVar1 = in[0x1a] >> 9;
  *puVar1 = (in[0x1b] & 0x3f) << 0x17 | *puVar1;
  puVar1 = out + 0x1e;
  *puVar1 = in[0x1b] >> 6;
  *puVar1 = (in[0x1c] & 7) << 0x1a | *puVar1;
  out[0x1f] = in[0x1c] >> 3;
  return in + 0x1d;
}

Assistant:

const uint32_t *__fastunpack29_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 26)) << (29 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 23)) << (29 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 20)) << (29 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 17)) << (29 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 14)) << (29 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 11)) << (29 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 8)) << (29 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 5)) << (29 - 5);
  out++;
  *out = ((*in) >> 5);
  ++in;
  *out |= ((*in) % (1U << 2)) << (29 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 29);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 28)) << (29 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 25)) << (29 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 22)) << (29 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 19)) << (29 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 16)) << (29 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 13)) << (29 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 10)) << (29 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 7)) << (29 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 4)) << (29 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  *out |= ((*in) % (1U << 1)) << (29 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 29);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 27)) << (29 - 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 24)) << (29 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 21)) << (29 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 18)) << (29 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 15)) << (29 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 12)) << (29 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 9)) << (29 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 6)) << (29 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 3)) << (29 - 3);
  out++;
  *out = ((*in) >> 3);
  ++in;
  out++;

  return in;
}